

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

void af_cjk_hints_compute_blue_edges(AF_GlyphHints hints,AF_CJKMetrics metrics,AF_Dimension dim)

{
  FT_Int32 FVar1;
  AF_Edge_conflict pAVar2;
  AF_CJKAxisRec *pAVar3;
  FT_Int32 b;
  long local_a0;
  long local_90;
  AF_CJKBlueRec *local_88;
  AF_Width compare;
  FT_Pos dist;
  FT_Bool is_major_dir;
  FT_Bool is_top_right_blue;
  AF_CJKBlue blue;
  FT_Pos best_dist;
  AF_Width best_blue;
  AF_CJKBlue pAStack_50;
  FT_UInt bb;
  FT_Pos best_dist0;
  FT_Fixed scale;
  AF_CJKAxis cjk;
  AF_Edge_conflict edge_limit;
  AF_Edge_conflict edge;
  AF_AxisHints axis;
  AF_Dimension dim_local;
  AF_CJKMetrics metrics_local;
  AF_GlyphHints hints_local;
  
  edge_limit = hints->axis[dim].edges;
  pAVar2 = edge_limit + hints->axis[dim].num_edges;
  pAVar3 = metrics->axis + dim;
  b = (FT_Int32)pAVar3->scale;
  FVar1 = FT_MulFix_x86_64(metrics->units_per_em / 0x28,b);
  pAStack_50 = (AF_CJKBlue)(long)FVar1;
  if (0x20 < (long)pAStack_50) {
    pAStack_50 = (AF_CJKBlue)0x20;
  }
  for (; edge_limit < pAVar2; edge_limit = edge_limit + 1) {
    best_dist = 0;
    blue = pAStack_50;
    for (best_blue._4_4_ = 0; best_blue._4_4_ < pAVar3->blue_count;
        best_blue._4_4_ = best_blue._4_4_ + 1) {
      local_88 = pAVar3->blues + best_blue._4_4_;
      if (((local_88->flags & 1) != 0) &&
         (((local_88->flags & 2) != 0) != ((int)edge_limit->dir == hints->axis[dim].major_dir))) {
        if ((long)edge_limit->fpos - (local_88->ref).org < 0) {
          local_90 = -((long)edge_limit->fpos - (local_88->ref).org);
        }
        else {
          local_90 = (long)edge_limit->fpos - (local_88->ref).org;
        }
        if ((long)edge_limit->fpos - (local_88->shoot).org < 0) {
          local_a0 = -((long)edge_limit->fpos - (local_88->shoot).org);
        }
        else {
          local_a0 = (long)edge_limit->fpos - (local_88->shoot).org;
        }
        if (local_a0 < local_90) {
          local_88 = (AF_CJKBlueRec *)&local_88->shoot;
        }
        compare = (AF_Width)((long)edge_limit->fpos - (local_88->ref).org);
        if ((long)compare < 0) {
          compare = (AF_Width)-(long)compare;
        }
        FVar1 = FT_MulFix_x86_64((FT_Int32)compare,b);
        if ((long)FVar1 < (long)blue) {
          best_dist = (FT_Pos)local_88;
          blue = (AF_CJKBlue)(long)FVar1;
        }
      }
    }
    if (best_dist != 0) {
      edge_limit->blue_edge = (AF_Width)best_dist;
    }
  }
  return;
}

Assistant:

static void
  af_cjk_hints_compute_blue_edges( AF_GlyphHints  hints,
                                   AF_CJKMetrics  metrics,
                                   AF_Dimension   dim )
  {
    AF_AxisHints  axis       = &hints->axis[dim];
    AF_Edge       edge       = axis->edges;
    AF_Edge       edge_limit = edge + axis->num_edges;
    AF_CJKAxis    cjk        = &metrics->axis[dim];
    FT_Fixed      scale      = cjk->scale;
    FT_Pos        best_dist0;  /* initial threshold */


    /* compute the initial threshold as a fraction of the EM size */
    best_dist0 = FT_MulFix( metrics->units_per_em / 40, scale );

    if ( best_dist0 > 64 / 2 ) /* maximum 1/2 pixel */
      best_dist0 = 64 / 2;

    /* compute which blue zones are active, i.e. have their scaled */
    /* size < 3/4 pixels                                           */

    /* If the distant between an edge and a blue zone is shorter than */
    /* best_dist0, set the blue zone for the edge.  Then search for   */
    /* the blue zone with the smallest best_dist to the edge.         */

    for ( ; edge < edge_limit; edge++ )
    {
      FT_UInt   bb;
      AF_Width  best_blue = NULL;
      FT_Pos    best_dist = best_dist0;


      for ( bb = 0; bb < cjk->blue_count; bb++ )
      {
        AF_CJKBlue  blue = cjk->blues + bb;
        FT_Bool     is_top_right_blue, is_major_dir;


        /* skip inactive blue zones (i.e., those that are too small) */
        if ( !( blue->flags & AF_CJK_BLUE_ACTIVE ) )
          continue;

        /* if it is a top zone, check for right edges -- if it is a bottom */
        /* zone, check for left edges                                      */
        /*                                                                 */
        /* of course, that's for TrueType                                  */
        is_top_right_blue =
          (FT_Byte)( ( blue->flags & AF_CJK_BLUE_TOP ) != 0 );
        is_major_dir =
          FT_BOOL( edge->dir == axis->major_dir );

        /* if it is a top zone, the edge must be against the major    */
        /* direction; if it is a bottom zone, it must be in the major */
        /* direction                                                  */
        if ( is_top_right_blue ^ is_major_dir )
        {
          FT_Pos    dist;
          AF_Width  compare;


          /* Compare the edge to the closest blue zone type */
          if ( FT_ABS( edge->fpos - blue->ref.org ) >
               FT_ABS( edge->fpos - blue->shoot.org ) )
            compare = &blue->shoot;
          else
            compare = &blue->ref;

          dist = edge->fpos - compare->org;
          if ( dist < 0 )
            dist = -dist;

          dist = FT_MulFix( dist, scale );
          if ( dist < best_dist )
          {
            best_dist = dist;
            best_blue = compare;
          }
        }
      }

      if ( best_blue )
        edge->blue_edge = best_blue;
    }
  }